

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

size_t __thiscall
cmCTestMultiProcessHandler::GetProcessorsUsed(cmCTestMultiProcessHandler *this,int test)

{
  mapped_type *ppcVar1;
  ulong uVar2;
  int local_c;
  
  local_c = test;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_c);
  uVar2 = (long)(*ppcVar1)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar1)->Processors) {
    uVar2 = this->ParallelLevel;
  }
  return uVar2;
}

Assistant:

inline size_t cmCTestMultiProcessHandler::GetProcessorsUsed(int test)
{
  size_t processors = static_cast<int>(this->Properties[test]->Processors);
  // If processors setting is set higher than the -j
  // setting, we default to using all of the process slots.
  if (processors > this->ParallelLevel) {
    processors = this->ParallelLevel;
  }
  return processors;
}